

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v9::detail::write_int_noinline<char,fmt::v9::appender,unsigned_int>
                   (appender out,write_int_arg<unsigned_int> arg,basic_format_specs<char> *specs,
                   locale_ref loc)

{
  presentation_type pVar1;
  int iVar2;
  size_t sVar3;
  bool bVar4;
  uint uVar5;
  char *digits_1;
  ulong uVar6;
  appender aVar7;
  long lVar8;
  byte *pbVar9;
  char *pcVar10;
  write_int_arg<unsigned_int> wVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  char *pcVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  appender it;
  ulong uVar19;
  format_decimal_result<char_*> fVar20;
  char buffer [10];
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_60;
  undefined1 local_58 [32];
  bool local_38;
  
  pVar1 = specs->type;
  local_60 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  if (chr < pVar1) {
switchD_0012184a_caseD_7:
    throw_format_error("invalid type specifier");
  }
  uVar19 = (ulong)arg >> 0x20;
  uVar16 = arg.prefix;
  uVar13 = arg.abs_value;
  switch(pVar1) {
  case none:
  case dec:
    break;
  case oct:
    uVar12 = 0x1f;
    if ((uVar13 | 1) != 0) {
      for (; (uVar13 | 1) >> uVar12 == 0; uVar12 = uVar12 - 1) {
      }
    }
    uVar6 = (ulong)uVar12;
    uVar12 = (int)(uVar6 * 0x55555556 >> 0x20) + 1;
    if (((char)*(ushort *)&specs->field_0x9 < '\0') &&
       (uVar13 != 0 && specs->precision <= (int)uVar12)) {
      uVar13 = 0x3000;
      if (uVar19 == 0) {
        uVar13 = 0x30;
      }
      uVar19 = (ulong)((uVar13 | uVar16) + 0x1000000);
    }
    uVar18 = (ulong)uVar12;
    uVar13 = specs->width;
    iVar2 = specs->precision;
    local_58._0_4_ = (undefined4)uVar19;
    if (iVar2 == -1 && uVar13 == 0) {
      if ((local_58._0_4_ != 0) && (uVar13 = local_58._0_4_ & 0xffffff, (uVar19 & 0xffffff) != 0)) {
        do {
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
          }
          lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                   0x10) = lVar8 + 1;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 8) + lVar8) = (char)uVar13;
          bVar4 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar4);
      }
      lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10);
      uVar19 = lVar8 + uVar18;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x18) < uVar19) {
        lVar8 = 0;
      }
      else {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar19;
        lVar8 = lVar8 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                        container + 8);
      }
      if (lVar8 != 0) {
        pbVar9 = (byte *)(lVar8 + uVar6 / 3);
        wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
        do {
          uVar13 = arg.abs_value;
          *pbVar9 = (byte)arg.abs_value & 7 | 0x30;
          wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 3);
          pbVar9 = pbVar9 + -1;
          arg = wVar11;
        } while (7 < uVar13);
        return (appender)
               out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      pcVar14 = local_58 + uVar18;
      pbVar9 = local_58 + uVar6 / 3;
      wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar13 = arg.abs_value;
        *pbVar9 = (byte)arg.abs_value & 7 | 0x30;
        wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 3);
        pbVar9 = pbVar9 + -1;
        arg = wVar11;
      } while (7 < uVar13);
      goto LAB_00121ec5;
    }
    uVar16 = ((uint)local_58._0_4_ >> 0x18) + uVar12;
    local_58._8_8_ = ZEXT48(uVar16);
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if (uVar16 < uVar13) {
        local_58._16_8_ = (ulong)uVar13 - local_58._8_8_;
        local_58._8_8_ = (ulong)uVar13;
        goto LAB_00121db7;
      }
    }
    else {
      local_58._16_8_ = ZEXT48(iVar2 - uVar12);
      if (iVar2 - uVar12 != 0 && (int)uVar12 <= iVar2) {
        local_58._8_8_ = ZEXT48(iVar2 + ((uint)local_58._0_4_ >> 0x18));
        goto LAB_00121db7;
      }
    }
    local_58._16_8_ = 0;
LAB_00121db7:
    local_58._24_8_ = uVar18 << 0x20 | (ulong)arg & 0xffffffff;
    aVar7 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,local_58._8_8_,local_58._8_8_,(anon_class_32_3_03e05ccd *)local_58)
    ;
    return (appender)
           aVar7.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  case hex_lower:
  case hex_upper:
    local_38 = pVar1 == hex_upper;
    if ((char)*(ushort *)&specs->field_0x9 < '\0') {
      uVar5 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar12 = uVar5 << 8;
      if (uVar19 == 0) {
        uVar12 = uVar5;
      }
      uVar19 = (ulong)((uVar12 | uVar16) + 0x2000000);
    }
    uVar16 = 0x1f;
    if ((uVar13 | 1) != 0) {
      for (; (uVar13 | 1) >> uVar16 == 0; uVar16 = uVar16 - 1) {
      }
    }
    uVar16 = 8 - ((uVar16 ^ 0x1c) >> 2);
    uVar6 = (ulong)uVar16;
    uVar13 = specs->width;
    iVar2 = specs->precision;
    local_58._0_4_ = (undefined4)uVar19;
    if (iVar2 == -1 && uVar13 == 0) {
      if ((local_58._0_4_ != 0) && (uVar13 = local_58._0_4_ & 0xffffff, (uVar19 & 0xffffff) != 0)) {
        do {
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
          }
          lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                   0x10) = lVar8 + 1;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 8) + lVar8) = (char)uVar13;
          bVar4 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar4);
      }
      lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10);
      uVar19 = lVar8 + uVar6;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x18) < uVar19) {
        lVar8 = 0;
      }
      else {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar19;
        lVar8 = lVar8 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                        container + 8);
      }
      if (lVar8 != 0) {
        pcVar14 = "0123456789abcdef";
        if (pVar1 == hex_upper) {
          pcVar14 = "0123456789ABCDEF";
        }
        pcVar10 = (char *)(lVar8 + uVar6);
        wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
        do {
          pcVar10 = pcVar10 + -1;
          uVar13 = arg.abs_value;
          *pcVar10 = pcVar14[uVar13 & 0xf];
          wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 4);
          arg = wVar11;
        } while (0xf < uVar13);
        return (appender)
               out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      pcVar14 = local_58 + uVar6;
      pcVar10 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar10 = "0123456789ABCDEF";
      }
      pcVar15 = (char *)((long)&local_60.container + uVar6 + 7);
      wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar13 = arg.abs_value;
        *pcVar15 = pcVar10[uVar13 & 0xf];
        wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 4);
        pcVar15 = pcVar15 + -1;
        arg = wVar11;
      } while (0xf < uVar13);
      goto LAB_00121ec5;
    }
    iVar17 = (int)(uVar19 >> 0x18);
    uVar12 = iVar17 + uVar16;
    local_58._8_8_ = ZEXT48(uVar12);
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if (uVar12 < uVar13) {
        local_58._16_8_ = (ulong)uVar13 - local_58._8_8_;
        local_58._8_8_ = (ulong)uVar13;
        goto LAB_00121bf1;
      }
    }
    else if ((int)uVar16 < iVar2) {
      local_58._8_8_ = ZEXT48((uint)(iVar17 + iVar2));
      local_58._16_8_ = ZEXT48(iVar2 - uVar16);
      goto LAB_00121bf1;
    }
    local_58._16_8_ = 0;
LAB_00121bf1:
    local_58._24_8_ = uVar6 << 0x20 | (ulong)arg & 0xffffffff;
    aVar7 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,local_58._8_8_,local_58._8_8_,(anon_class_40_3_03e05ccd *)local_58)
    ;
    return (appender)
           aVar7.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  case bin_lower:
  case bin_upper:
    if ((char)*(ushort *)&specs->field_0x9 < '\0') {
      uVar5 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar12 = uVar5 << 8;
      if (uVar19 == 0) {
        uVar12 = uVar5;
      }
      uVar19 = (ulong)((uVar12 | uVar16) + 0x2000000);
    }
    uVar16 = 0x1f;
    if ((uVar13 | 1) != 0) {
      for (; (uVar13 | 1) >> uVar16 == 0; uVar16 = uVar16 - 1) {
      }
    }
    uVar16 = (uVar16 ^ 0xffffffe0) + 0x21;
    uVar6 = (ulong)uVar16;
    uVar13 = specs->width;
    iVar2 = specs->precision;
    local_58._0_4_ = (undefined4)uVar19;
    if (iVar2 == -1 && uVar13 == 0) {
      if ((local_58._0_4_ != 0) && (uVar13 = local_58._0_4_ & 0xffffff, (uVar19 & 0xffffff) != 0)) {
        do {
          if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10) + 1U) {
            (*(code *)**(undefined8 **)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                      (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
          }
          lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 0x10);
          *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                   0x10) = lVar8 + 1;
          *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                    container + 8) + lVar8) = (char)uVar13;
          bVar4 = 0xff < uVar13;
          uVar13 = uVar13 >> 8;
        } while (bVar4);
      }
      lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10);
      uVar19 = lVar8 + uVar6;
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                    + 0x18) < uVar19) {
        lVar8 = 0;
      }
      else {
        *(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                  0x10) = uVar19;
        lVar8 = lVar8 + *(long *)((long)out.
                                        super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                        container + 8);
      }
      if (lVar8 != 0) {
        pbVar9 = (byte *)(lVar8 + uVar6);
        wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
        do {
          pbVar9 = pbVar9 + -1;
          uVar13 = arg.abs_value;
          *pbVar9 = (byte)arg.abs_value & 1 | 0x30;
          wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 1);
          arg = wVar11;
        } while (1 < uVar13);
        return (appender)
               out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
      }
      pcVar14 = local_58 + uVar6;
      pbVar9 = (byte *)((long)&local_60.container + uVar6 + 7);
      wVar11 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
      do {
        uVar13 = arg.abs_value;
        *pbVar9 = (byte)arg.abs_value & 1 | 0x30;
        wVar11 = (write_int_arg<unsigned_int>)((ulong)wVar11 >> 1);
        pbVar9 = pbVar9 + -1;
        arg = wVar11;
      } while (1 < uVar13);
      goto LAB_00121ec5;
    }
    iVar17 = (int)(uVar19 >> 0x18);
    uVar12 = iVar17 + uVar16;
    local_58._8_8_ = ZEXT48(uVar12);
    if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
      if (uVar12 < uVar13) {
        local_58._16_8_ = (ulong)uVar13 - local_58._8_8_;
        local_58._8_8_ = (ulong)uVar13;
        goto LAB_00121bb5;
      }
    }
    else if ((int)uVar16 < iVar2) {
      local_58._8_8_ = ZEXT48((uint)(iVar17 + iVar2));
      local_58._16_8_ = ZEXT48(iVar2 - uVar16);
      goto LAB_00121bb5;
    }
    local_58._16_8_ = 0;
LAB_00121bb5:
    local_58._24_8_ = uVar6 << 0x20 | (ulong)arg & 0xffffffff;
    aVar7 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,local_58._8_8_,local_58._8_8_,(anon_class_32_3_03e05ccd *)local_58)
    ;
    return (appender)
           aVar7.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  default:
    goto switchD_0012184a_caseD_7;
  case chr:
    local_58[1] = (char)arg.abs_value;
    local_58[0] = pVar1 == debug;
    aVar7 = write_padded<(fmt::v9::align::type)1,fmt::v9::appender,char,fmt::v9::detail::write_char<char,fmt::v9::appender>(fmt::v9::appender,char,fmt::v9::basic_format_specs<char>const&)::_lambda(fmt::v9::appender)_1_&>
                      (out,specs,1,1,(anon_class_2_2_bf5026b7 *)local_58);
    return (appender)
           aVar7.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  if (((specs->field_0xa & 1) != 0) &&
     (bVar4 = write_int_localized<fmt::v9::appender,unsigned_long,char>
                        ((appender *)&local_60,(ulong)arg & 0xffffffff,uVar16,specs,loc), bVar4)) {
    return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_60.container;
  }
  out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_60.container;
  uVar12 = 0x1f;
  if ((uVar13 | 1) != 0) {
    for (; (uVar13 | 1) >> uVar12 == 0; uVar12 = uVar12 - 1) {
    }
  }
  uVar6 = ((ulong)arg & 0xffffffff) +
          *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar12 * 8);
  uVar12 = specs->width;
  iVar2 = specs->precision;
  iVar17 = (int)(uVar6 >> 0x20);
  if (iVar2 == -1 && uVar12 == 0) {
    if ((uVar19 != 0) && (uVar16 = uVar16 & 0xffffff, ((ulong)arg & 0xffffff00000000) != 0)) {
      do {
        if (((buffer<char> *)
            out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->capacity_ <
            ((buffer<char> *)
            out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->size_ + 1) {
          (**((buffer<char> *)
             out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->_vptr_buffer
          )(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
        }
        sVar3 = ((buffer<char> *)
                out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->size_;
        ((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->
        size_ = sVar3 + 1;
        ((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->
        ptr_[sVar3] = (char)uVar16;
        bVar4 = 0xff < uVar16;
        uVar16 = uVar16 >> 8;
      } while (bVar4);
    }
    fVar20 = format_decimal<char,unsigned_int>(local_58,uVar13,iVar17);
    pcVar14 = fVar20.end;
LAB_00121ec5:
    aVar7 = copy_str_noinline<char,char*,fmt::v9::appender>(local_58,pcVar14,out);
    return (appender)
           aVar7.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  uVar13 = (uint)arg.prefix._3_1_ + iVar17;
  local_58._8_8_ = ZEXT48(uVar13);
  if ((*(ushort *)&specs->field_0x9 & 0xf) == 4) {
    if (uVar13 < uVar12) {
      local_58._16_8_ = (ulong)uVar12 - local_58._8_8_;
      local_58._8_8_ = (ulong)uVar12;
      goto LAB_00121c98;
    }
  }
  else {
    local_58._16_8_ = ZEXT48((uint)(iVar2 - iVar17));
    if (iVar2 - iVar17 != 0 && iVar17 <= iVar2) {
      local_58._8_8_ = ZEXT48(iVar2 + (uint)arg.prefix._3_1_);
      goto LAB_00121c98;
    }
  }
  local_58._16_8_ = 0;
LAB_00121c98:
  local_58._24_8_ = uVar6 & 0xffffffff00000000 | (ulong)arg & 0xffffffff;
  local_58._0_4_ = uVar16;
  aVar7 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_int>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_int>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_)::_lambda(fmt::v9::appender)_1_&>
                    ((appender)local_60.container,specs,local_58._8_8_,local_58._8_8_,
                     (anon_class_32_3_03e05ccd *)local_58);
  return (appender)
         aVar7.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}